

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::BustColorCache(char *plot_title_id)

{
  ImPlotContext *this;
  ImGuiID key;
  ImGuiWindow *this_00;
  ImPlotPlot *pIVar1;
  ImPlotPlot *plot;
  ImPlotContext *gp;
  char *plot_title_id_local;
  
  this = GImPlot;
  if (plot_title_id == (char *)0x0) {
    BustItemCache();
  }
  else {
    this_00 = ImGui::GetCurrentWindow();
    key = ImGuiWindow::GetID(this_00,plot_title_id,(char *)0x0);
    pIVar1 = ImPool<ImPlotPlot>::GetByKey(&this->Plots,key);
    if (pIVar1 != (ImPlotPlot *)0x0) {
      pIVar1->ColormapIdx = 0;
      ImPool<ImPlotItem>::Clear(&pIVar1->Items);
      ImPlotLegendData::Reset(&pIVar1->LegendData);
    }
  }
  return;
}

Assistant:

void BustColorCache(const char* plot_title_id) {
    ImPlotContext& gp = *GImPlot;
    if (plot_title_id == NULL) {
        BustItemCache();
    }
    else {
        ImPlotPlot* plot = gp.Plots.GetByKey(ImGui::GetCurrentWindow()->GetID(plot_title_id));
        if (plot == NULL)
            return;
        plot->ColormapIdx = 0;
        plot->Items.Clear();
        plot->LegendData.Reset();
    }
}